

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcScheduleTimeControl::IfcScheduleTimeControl
          (IfcScheduleTimeControl *this)

{
  IfcScheduleTimeControl *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x270,"IfcScheduleTimeControl");
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__00fccee0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcScheduleTimeControl,_18UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcScheduleTimeControl,_18UL>,
             &PTR_construction_vtable_24__00fccf90);
  *(undefined8 *)this = 0xfcce00;
  *(undefined8 *)&this->field_0x270 = 0xfccec8;
  *(undefined8 *)&this->field_0x88 = 0xfcce28;
  *(undefined8 *)&this->field_0x98 = 0xfcce50;
  *(undefined8 *)&this->field_0xd0 = 0xfcce78;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcScheduleTimeControl,_18UL>).
  _vptr_ObjectHelper = (_func_int **)0xfccea0;
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe
            ((Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcScheduleTimeControl,_18UL>).
              field_0x10);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe(&this->EarlyStart);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe(&this->LateStart);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe(&this->ScheduleStart);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe(&this->ActualFinish);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe(&this->EarlyFinish);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe(&this->LateFinish);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe(&this->ScheduleFinish)
  ;
  STEP::Maybe<double>::Maybe(&this->ScheduleDuration);
  STEP::Maybe<double>::Maybe(&this->ActualDuration);
  STEP::Maybe<double>::Maybe(&this->RemainingTime);
  STEP::Maybe<double>::Maybe(&this->FreeFloat);
  STEP::Maybe<double>::Maybe(&this->TotalFloat);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->IsCritical);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe(&this->StatusTime);
  STEP::Maybe<double>::Maybe(&this->StartFloat);
  STEP::Maybe<double>::Maybe(&this->FinishFloat);
  STEP::Maybe<double>::Maybe(&this->Completion);
  return;
}

Assistant:

IfcScheduleTimeControl() : Object("IfcScheduleTimeControl") {}